

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StateBlockBuilder.cpp
# Opt level: O1

AppStatePtr MakeState_BlockBuilder(void)

{
  size_type *psVar1;
  _func_int **pp_Var2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  undefined8 uVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  *this;
  pointer pHVar10;
  undefined8 *puVar11;
  undefined8 *puVar12;
  long lVar13;
  char *pcVar14;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  pointer pHVar16;
  size_t __n;
  long *in_RDI;
  _func_int **pp_Var17;
  _func_int **pp_Var18;
  long lVar19;
  AppStatePtr AVar20;
  enable_shared_from_this<(anonymous_namespace)::StateBlockBuilder> *__base;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_120;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_118;
  _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  *local_110;
  long *local_108;
  _func_int *local_100;
  size_type local_f8;
  uint local_f0;
  undefined2 uStack_ec;
  undefined2 uStack_ea;
  _func_int *p_Stack_e8;
  undefined1 local_e0 [116];
  undefined4 local_6c;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_68;
  undefined8 uStack_50;
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  local_48;
  
  local_108 = in_RDI;
  p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x340);
  p_Var9->_M_use_count = 1;
  p_Var9->_M_weak_count = 1;
  p_Var9->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001e3f88;
  local_120 = p_Var9 + 1;
  *(undefined1 *)&p_Var9[1]._M_use_count = 0;
  local_128 = p_Var9 + 2;
  p_Var9[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var9[2]._M_use_count = 0;
  p_Var9[2]._M_weak_count = 0;
  p_Var9[1]._vptr__Sp_counted_base = (_func_int **)&PTR__StateBlockBuilder_001e3fd8;
  GUILayout::GUILayout((GUILayout *)(p_Var9 + 3));
  p_Var9[3]._vptr__Sp_counted_base = (_func_int **)&PTR__LayoutBlockBuilder_001e42e8;
  *(_Atomic_word **)&p_Var9[7]._M_use_count = &p_Var9[8]._M_use_count;
  p_Var9[8]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var9[8]._M_use_count = 0;
  p_Var9[0xb]._vptr__Sp_counted_base = (_func_int **)(p_Var9 + 0xc);
  p_Var9[0xb]._M_use_count = 0;
  p_Var9[0xb]._M_weak_count = 0;
  *(undefined1 *)&p_Var9[0xc]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&p_Var9[0xe]._M_use_count = &p_Var9[0xf]._M_use_count;
  p_Var9[0xf]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var9[0xf]._M_use_count = 0;
  p_Var9[0x12]._vptr__Sp_counted_base = (_func_int **)(p_Var9 + 0x13);
  p_Var9[0x12]._M_use_count = 0;
  p_Var9[0x12]._M_weak_count = 0;
  *(undefined1 *)&p_Var9[0x13]._vptr__Sp_counted_base = 0;
  *(_Atomic_word **)&p_Var9[0x15]._M_use_count = &p_Var9[0x16]._M_use_count;
  p_Var9[0x16]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(undefined1 *)&p_Var9[0x16]._M_use_count = 0;
  p_Var9[0x19]._vptr__Sp_counted_base = (_func_int **)(p_Var9 + 0x1a);
  p_Var9[0x19]._M_use_count = 0;
  p_Var9[0x19]._M_weak_count = 0;
  *(undefined1 *)&p_Var9[0x1a]._vptr__Sp_counted_base = 0;
  memset(&p_Var9[0x1c]._M_use_count,0,0x91);
  p_Var9[0x25]._M_weak_count = 3;
  memset(p_Var9 + 0x26,0,0xb1);
  *(undefined4 *)((long)&p_Var9[0x31]._vptr__Sp_counted_base + 4) = 3;
  p_Var9[0x31]._M_use_count = 0;
  p_Var9[0x31]._M_weak_count = 0;
  p_Var9[0x32]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var9[0x32]._M_use_count = 0;
  p_Var9[0x32]._M_weak_count = 0;
  p_Var9[0x33]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var9[0x33]._M_use_count = 0;
  p_Var9[0x33]._M_weak_count = 0;
  memset(&local_100,0,0x91);
  local_6c = 3;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_50 = 0;
  memcpy(&p_Var9[0x1c]._M_use_count,&local_100,0x98);
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var9[0x26]._vptr__Sp_counted_base;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = *(pointer *)&p_Var9[0x26]._M_use_count;
  local_48.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)p_Var9[0x27]._vptr__Sp_counted_base;
  p_Var9[0x26]._vptr__Sp_counted_base =
       (_func_int **)
       local_68.
       super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)&p_Var9[0x26]._M_use_count =
       local_68.
       super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  p_Var9[0x27]._vptr__Sp_counted_base =
       (_func_int **)
       local_68.
       super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_48);
  p_Var9[0x27]._M_use_count = 0;
  p_Var9[0x27]._M_weak_count = 0;
  std::
  vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
  ::~vector(&local_68);
  local_f0 = 0x74706d65;
  uStack_ec = 0x79;
  local_f8 = 5;
  __n = 0;
  local_100 = (_func_int *)&local_f0;
  memset(local_e0,0,0x91);
  uStack_50 = CONCAT44(3,(undefined4)uStack_50);
  pp_Var2 = *(_func_int ***)&p_Var9[0x26]._M_use_count;
  if (pp_Var2 == p_Var9[0x27]._vptr__Sp_counted_base) {
    local_118 = p_Var9 + 0x28;
    this = (_Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
            *)std::
              vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
              ::_M_check_len((vector<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
                              *)(p_Var9 + 0x26),__n,__s);
    pp_Var3 = p_Var9[0x26]._vptr__Sp_counted_base;
    pp_Var4 = *(_func_int ***)&p_Var9[0x26]._M_use_count;
    pHVar10 = std::
              _Vector_base<(anonymous_namespace)::BlockEditData::HistoryItem,_std::allocator<(anonymous_namespace)::BlockEditData::HistoryItem>_>
              ::_M_allocate(this,__n);
    lVar13 = (long)pp_Var2 - (long)pp_Var3;
    psVar1 = (size_type *)((long)pHVar10 + lVar13);
    puVar11 = (undefined8 *)((long)pHVar10 + lVar13 + 0x10);
    *(undefined8 **)((long)pHVar10 + lVar13) = puVar11;
    if (local_100 == (_func_int *)&local_f0) {
      *puVar11 = CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
      *(_func_int **)((long)pHVar10 + lVar13 + 0x18) = p_Stack_e8;
    }
    else {
      *psVar1 = (size_type)local_100;
      psVar1[2] = CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
    }
    psVar1[1] = local_f8;
    local_f8 = 0;
    local_f0 = local_f0 & 0xffffff00;
    local_110 = this;
    local_100 = (_func_int *)&local_f0;
    memcpy(psVar1 + 4,local_e0,0x98);
    pHVar16 = pHVar10;
    if (pp_Var3 != pp_Var2) {
      paVar8 = &(pHVar10->label).field_2;
      pp_Var17 = pp_Var3 + 2;
      do {
        paVar15 = paVar8;
        (((string *)(paVar15 + -1))->_M_dataplus)._M_p = (pointer)paVar15;
        if (pp_Var17 == (_func_int **)pp_Var17[-2]) {
          p_Var5 = pp_Var17[1];
          paVar15->_M_allocated_capacity = (size_type)*pp_Var17;
          *(_func_int **)((long)paVar15 + 8) = p_Var5;
        }
        else {
          (((string *)(paVar15 + -1))->_M_dataplus)._M_p = (pointer)pp_Var17[-2];
          paVar15->_M_allocated_capacity = (size_type)*pp_Var17;
        }
        *(_func_int **)((long)paVar15 + -8) = pp_Var17[-1];
        pp_Var17[-2] = (_func_int *)pp_Var17;
        pp_Var17[-1] = (_func_int *)0x0;
        *(undefined1 *)pp_Var17 = 0;
        memcpy(paVar15 + 1,pp_Var17 + 2,0x98);
        pp_Var18 = pp_Var17 + 0x15;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)paVar15 + 0xb8);
        pp_Var17 = pp_Var17 + 0x17;
      } while (pp_Var18 != pp_Var2);
      pHVar16 = (pointer)((long)paVar15 + 0xa8);
    }
    if (pp_Var4 != pp_Var2) {
      lVar13 = 0;
      do {
        lVar19 = lVar13;
        pcVar14 = pHVar16[1].block.name + lVar19 + -0x10;
        *(char **)(pHVar16[1].block.name + lVar19 + -0x20) = pcVar14;
        puVar11 = (undefined8 *)(lVar19 + (long)pp_Var2);
        puVar12 = puVar11 + 2;
        if (puVar12 == (undefined8 *)*puVar11) {
          uVar6 = puVar11[3];
          *(undefined8 *)pcVar14 = *puVar12;
          *(undefined8 *)(pHVar16[1].block.name + lVar19 + -8) = uVar6;
        }
        else {
          *(undefined8 **)(pHVar16[1].block.name + lVar19 + -0x20) = (undefined8 *)*puVar11;
          *(undefined8 *)(pHVar16[1].block.name + lVar19 + -0x10) = *puVar12;
        }
        puVar11 = (undefined8 *)(lVar19 + (long)pp_Var2);
        pcVar14 = pHVar16[1].block.name + lVar19;
        *(undefined8 *)(pcVar14 + -0x18) = puVar11[1];
        *puVar11 = puVar12;
        puVar11[1] = 0;
        *(undefined1 *)(puVar11 + 2) = 0;
        memcpy(pcVar14,puVar11 + 4,0x98);
        lVar13 = lVar19 + 0xb8;
      } while ((_func_int **)((long)pp_Var2 + lVar19 + 0xb8) != pp_Var4);
      pHVar16 = (pointer)(pHVar16[1].block.name + lVar19 + -0x20);
    }
    if (pp_Var3 != (_func_int **)0x0) {
      operator_delete(pp_Var3,(long)p_Var9[0x27]._vptr__Sp_counted_base - (long)pp_Var3);
    }
    p_Var9[0x26]._vptr__Sp_counted_base = (_func_int **)pHVar10;
    *(pointer *)&p_Var9[0x26]._M_use_count = pHVar16 + 1;
    p_Var9[0x27]._vptr__Sp_counted_base = (_func_int **)(pHVar10 + (long)local_110);
  }
  else {
    *pp_Var2 = (_func_int *)(pp_Var2 + 2);
    if (local_100 == (_func_int *)&local_f0) {
      pp_Var2[2] = (_func_int *)CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
      pp_Var2[3] = p_Stack_e8;
    }
    else {
      *pp_Var2 = local_100;
      pp_Var2[2] = (_func_int *)CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0));
    }
    pp_Var2[1] = (_func_int *)0x5;
    local_f8 = 0;
    local_f0 = local_f0 & 0xffffff00;
    local_100 = (_func_int *)&local_f0;
    memcpy(pp_Var2 + 4,local_e0,0x98);
    *(long *)&p_Var9[0x26]._M_use_count = *(long *)&p_Var9[0x26]._M_use_count + 0xb8;
  }
  if (local_100 != (_func_int *)&local_f0) {
    operator_delete(local_100,CONCAT26(uStack_ea,CONCAT24(uStack_ec,local_f0)) + 1);
  }
  p_Var7 = local_120;
  *(undefined4 *)((long)&p_Var9[0x31]._vptr__Sp_counted_base + 4) = 0;
  local_130._M_pi = p_Var9;
  if ((*(long *)&p_Var9[2]._M_use_count == 0) ||
     (*(int *)(*(long *)&p_Var9[2]._M_use_count + 8) == 0)) {
    local_128->_vptr__Sp_counted_base = (_func_int **)local_120;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var9[2]._M_use_count,&local_130);
  }
  *local_108 = (long)p_Var7;
  local_108[1] = 0;
  local_108[1] = (long)local_130._M_pi;
  AVar20.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  AVar20.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_108
  ;
  return (AppStatePtr)AVar20.super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AppStatePtr MakeState_BlockBuilder()
{
    return std::make_shared<StateBlockBuilder>();
}